

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

double helicsInputGetDouble(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffffd0;
  HelicsInput in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pIVar1 == (InputObject *)0x0) {
    local_8 = -1e+49;
  }
  else {
    local_8 = helics::Input::getValue<double>(in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

double helicsInputGetDouble(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_INVALID_DOUBLE;
    }
    try {
        return inpObj->inputPtr->getValue<double>();
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_INVALID_DOUBLE;
    }
}